

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

int __thiscall HevcSpsUnit::sub_layer_hrd_parameters(HevcSpsUnit *this,uint cpb_cnt_minus1)

{
  uint uVar1;
  uint local_20;
  uint i;
  uint cpb_cnt_minus1_local;
  HevcSpsUnit *this_local;
  
  local_20 = 0;
  do {
    if (cpb_cnt_minus1 < local_20) {
      return 0;
    }
    uVar1 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (uVar1 == 0xffffffff) {
      return 1;
    }
    uVar1 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
    if (uVar1 == 0xffffffff) {
      return 1;
    }
    if ((this->sub_pic_hrd_params_present_flag & 1U) != 0) {
      uVar1 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
      if (uVar1 == 0xffffffff) {
        return 1;
      }
      uVar1 = HevcUnit::extractUEGolombCode((HevcUnit *)this);
      if (uVar1 == 0xffffffff) {
        return 1;
      }
    }
    BitStreamReader::skipBit(&(this->super_HevcUnitWithProfile).super_HevcUnit.m_reader);
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

int HevcSpsUnit::sub_layer_hrd_parameters(const unsigned cpb_cnt_minus1)
{
    for (unsigned i = 0; i <= cpb_cnt_minus1; i++)
    {
        if (extractUEGolombCode() == UINT32_MAX)  // bit_rate_value_minus1[i]
            return 1;
        if (extractUEGolombCode() == UINT32_MAX)  // cpb_size_value_minus1[i]
            return 1;
        if (sub_pic_hrd_params_present_flag)
        {
            if (extractUEGolombCode() == UINT32_MAX)  // cpb_size_du_value_minus1[i]
                return 1;
            if (extractUEGolombCode() == UINT32_MAX)  // bit_rate_du_value_minus1[i]
                return 1;
        }
        m_reader.skipBit();  // cbr_flag[i]
    }
    return 0;
}